

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::
     generateBufferVariableArrayCases<(deqp::gles31::Functional::ProgramResourcePropFlags)4>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  SharedPtrStateBase *pSVar1;
  Node *pNVar2;
  SharedPtrStateBase *pSVar3;
  TestNode *pTVar4;
  bool extendedCases;
  Node *pNVar5;
  deInt32 *pdVar6;
  SharedPtr sized;
  ProgramResourceQueryTestTarget queryTarget;
  SharedPtr local_48;
  ProgramResourceQueryTestTarget local_38;
  
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_38,PROGRAMINTERFACE_BUFFER_VARIABLE,4);
  pNVar5 = parentStructure->m_ptr;
  if ((*(char *)&pNVar5[1]._vptr_Node == '\x01') &&
     (((pNVar5->m_enclosingNode).m_ptr)->m_type != TYPE_ARRAY_ELEMENT)) {
    pTVar4 = (TestNode *)operator_new(0x78);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,context->m_testCtx,"non_array","Non-array target");
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
    pTVar4[1]._vptr_TestNode = (_func_int **)context;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar4);
    generateVariableCases(context,parentStructure,(TestCaseGroup *)pTVar4,&local_38,1,false);
    pNVar5 = parentStructure->m_ptr;
    extendedCases = true;
  }
  else {
    extendedCases = false;
  }
  pNVar2 = (Node *)operator_new(0x28);
  pSVar1 = parentStructure->m_state;
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
  pNVar2->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar2->m_enclosingNode).m_ptr = pNVar5;
  (pNVar2->m_enclosingNode).m_state = pSVar1;
  if (pSVar1 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar1->strongRefCount = pSVar1->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
  *(undefined4 *)&pNVar2[1]._vptr_Node = 0xffffffff;
  local_48.m_state = (SharedPtrStateBase *)0x0;
  local_48.m_ptr = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  local_48.m_state = pSVar3;
  pTVar4 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,context->m_testCtx,"sized","Sized target");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
  pTVar4[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar4);
  generateBufferVariableArraySizeSubCases
            (context,&local_48,(TestCaseGroup *)pTVar4,PROGRAMRESOURCEPROP_ARRAY_STRIDE,true,
             extendedCases);
  pSVar1 = local_48.m_state;
  pdVar6 = &pSVar3->strongRefCount;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    local_48.m_ptr = (Node *)0x0;
    (*(local_48.m_state)->_vptr_SharedPtrStateBase[2])(local_48.m_state);
  }
  LOCK();
  pdVar6 = &pSVar1->weakRefCount;
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if ((*pdVar6 == 0) && (local_48.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_48.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pNVar2 = (Node *)operator_new(0x28);
  pNVar5 = parentStructure->m_ptr;
  pSVar1 = parentStructure->m_state;
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
  pNVar2->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar2->m_enclosingNode).m_ptr = pNVar5;
  (pNVar2->m_enclosingNode).m_state = pSVar1;
  if (pSVar1 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar1->strongRefCount = pSVar1->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
  *(undefined4 *)&pNVar2[1]._vptr_Node = 0xfffffffe;
  local_48.m_state = (SharedPtrStateBase *)0x0;
  local_48.m_ptr = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  local_48.m_state = pSVar3;
  pTVar4 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,context->m_testCtx,"unsized","Unsized target");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
  pTVar4[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar4);
  generateBufferVariableArraySizeSubCases
            (context,&local_48,(TestCaseGroup *)pTVar4,PROGRAMRESOURCEPROP_ARRAY_STRIDE,false,
             extendedCases);
  pSVar1 = local_48.m_state;
  pdVar6 = &pSVar3->strongRefCount;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    local_48.m_ptr = (Node *)0x0;
    (*(local_48.m_state)->_vptr_SharedPtrStateBase[2])(local_48.m_state);
  }
  LOCK();
  pdVar6 = &pSVar1->weakRefCount;
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if ((*pdVar6 == 0) && (local_48.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_48.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  return;
}

Assistant:

static void generateBufferVariableArrayCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup)
{
	const ProgramResourceQueryTestTarget	queryTarget			(PROGRAMINTERFACE_BUFFER_VARIABLE, TargetProp);
	const bool								namedNonArrayBlock	= static_cast<const ResourceDefinition::InterfaceBlock*>(parentStructure.get())->m_named && parentStructure->getEnclosingNode()->getType() != ResourceDefinition::Node::TYPE_ARRAY_ELEMENT;

	// .non_array
	if (namedNonArrayBlock)
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "non_array", "Non-array target");
		targetGroup->addChild(blockGroup);

		generateVariableCases(context, parentStructure, blockGroup, queryTarget, 1, false);
	}

	// .sized
	{
		const ResourceDefinition::Node::SharedPtr	sized		(new ResourceDefinition::ArrayElement(parentStructure));
		tcu::TestCaseGroup* const					blockGroup	= new TestCaseGroup(context, "sized", "Sized target");
		targetGroup->addChild(blockGroup);

		generateBufferVariableArraySizeSubCases(context, sized, blockGroup, TargetProp, true, namedNonArrayBlock);
	}

	// .unsized
	{
		const ResourceDefinition::Node::SharedPtr	unsized		(new ResourceDefinition::ArrayElement(parentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
		tcu::TestCaseGroup* const					blockGroup	= new TestCaseGroup(context, "unsized", "Unsized target");
		targetGroup->addChild(blockGroup);

		generateBufferVariableArraySizeSubCases(context, unsized, blockGroup, TargetProp, false, namedNonArrayBlock);
	}
}